

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte bVar1;
  int iVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  Extension *pEVar5;
  undefined4 extraout_var;
  Arena *pAVar7;
  ulong uVar8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar9;
  LogFinisher local_71;
  ExtensionSet *local_70;
  LogMessage local_68;
  MessageLite *pMVar6;
  
  if (message == (MessageLite *)0x0) {
    pEVar5 = FindOrNull(this,number);
    if (pEVar5 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar5);
    return;
  }
  uVar8 = (message->_internal_metadata_).ptr_;
  local_70 = this;
  if ((uVar8 & 2) == 0) {
    pAVar3 = (Arena *)(uVar8 & 0xfffffffffffffffc);
    if ((uVar8 & 1) == 0) {
      if (pAVar3 != (Arena *)0x0) {
LAB_003cc64b:
        if (pAVar3 != this->arena_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                     ,0x2a6);
          pLVar4 = LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: message->GetOwningArena() == nullptr || message->GetOwningArena() == arena_: "
                             );
          LogFinisher::operator=(&local_71,pLVar4);
          LogMessage::~LogMessage(&local_68);
          uVar8 = (message->_internal_metadata_).ptr_;
        }
      }
    }
    else if (*(long *)pAVar3 != 0) {
      pAVar3 = *(Arena **)pAVar3;
      goto LAB_003cc64b;
    }
  }
  if ((uVar8 & 2) == 0) {
    pAVar3 = (Arena *)(uVar8 & 0xfffffffffffffffc);
    if ((uVar8 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
  }
  else {
    pAVar3 = (Arena *)0x0;
  }
  pVar9 = Insert(local_70,number);
  pEVar5 = pVar9.first;
  pEVar5->descriptor = descriptor;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar5->is_repeated != false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    bVar1 = pEVar5->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if ((pEVar5->field_0xa & 0x10) != 0) {
      (*((pEVar5->field_0).message_value)->_vptr_MessageLite[5])
                ((pEVar5->field_0).message_value,message,local_70->arena_);
      goto LAB_003cc906;
    }
    pAVar7 = local_70->arena_;
    if (pAVar7 == (Arena *)0x0) {
      if ((pEVar5->field_0).message_value != (MessageLite *)0x0) {
        (*((pEVar5->field_0).message_value)->_vptr_MessageLite[1])();
        goto LAB_003cc7a8;
      }
      pAVar7 = (Arena *)0x0;
    }
  }
  else {
    pEVar5->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ab);
      pLVar4 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_71,pLVar4);
      LogMessage::~LogMessage(&local_68);
    }
    pEVar5->is_repeated = false;
    pEVar5->field_0xa = pEVar5->field_0xa & 0xf;
LAB_003cc7a8:
    pAVar7 = local_70->arena_;
  }
  if (pAVar3 == pAVar7) {
    (pEVar5->field_0).message_value = message;
  }
  else if (pAVar3 == (Arena *)0x0) {
    (pEVar5->field_0).message_value = message;
    ThreadSafeArena::AddCleanup
              ((ThreadSafeArena *)local_70->arena_,message,
               arena_delete_object<google::protobuf::MessageLite>);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[3])(message);
    pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    (pEVar5->field_0).message_value = pMVar6;
    (*pMVar6->_vptr_MessageLite[7])(pMVar6,message);
  }
LAB_003cc906:
  pEVar5->field_0xa = pEVar5->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  GOOGLE_DCHECK(message->GetOwningArena() == nullptr ||
         message->GetOwningArena() == arena_);
  Arena* message_arena = message->GetOwningArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == nullptr) {
      extension->message_value = message;
      arena_->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message, arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == nullptr) {
        extension->message_value = message;
        arena_->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}